

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8proc.c
# Opt level: O2

utf8proc_int32_t utf8proc_tolower(utf8proc_int32_t c)

{
  utf8proc_int32_t uVar1;
  utf8proc_property_t *puVar2;
  
  puVar2 = utf8proc_get_property(c);
  if (puVar2->lowercase_seqindex != 0xffff) {
    uVar1 = seqindex_decode_index((uint)puVar2->lowercase_seqindex);
    return uVar1;
  }
  return c;
}

Assistant:

UTF8PROC_DLLEXPORT utf8proc_int32_t utf8proc_tolower(utf8proc_int32_t c)
{
  utf8proc_int32_t cl = utf8proc_get_property(c)->lowercase_seqindex;
  return cl != UINT16_MAX ? seqindex_decode_index(cl) : c;
}